

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::RemoveFlowEdgeToCatchBlock(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  Instr *pIVar2;
  BasicBlock *succBlock;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  FlowEdge *pFVar7;
  BasicBlock *predBlock;
  
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fd1,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
    if (!bVar4) goto LAB_00469b3b;
    *puVar5 = 0;
  }
  if (instr->m_opcode == BrOnNoException) {
LAB_004697ed:
    pIVar6 = IR::Instr::GetNextRealInstrOrLabel(instr);
    if ((pIVar6->m_kind != InstrKindLabel) && (pIVar6->m_kind != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fde,"(nextInstr->IsLabelInstr())","nextInstr->IsLabelInstr()");
      if (!bVar4) goto LAB_00469b3b;
      *puVar5 = 0;
      if ((pIVar6->m_kind != InstrKindLabel) && (pIVar6->m_kind != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar4) goto LAB_00469b3b;
        *puVar5 = 0;
      }
    }
    if ((pIVar6[1].m_src2 != (Opnd *)0x0) && (*(char *)&(pIVar6[1].m_src2)->_vptr_Opnd == '\x03'))
    goto LAB_004698ca;
    pIVar2 = pIVar6->m_next;
    if (pIVar2->m_kind == InstrKindBranch) {
      OVar1 = pIVar2->m_opcode;
      if (OVar1 < ADD) {
        if ((OVar1 != Br) && (OVar1 != MultiBr)) goto LAB_00469902;
      }
      else {
        bVar4 = LowererMD::IsUnconditionalBranch(pIVar2);
        if (!bVar4) goto LAB_00469902;
      }
    }
    else {
LAB_00469902:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fe8,
                         "(nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional())"
                         ,
                         "nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional()"
                        );
      if (!bVar4) goto LAB_00469b3b;
      *puVar5 = 0;
    }
    pIVar2 = pIVar6->m_next;
    predBlock = (BasicBlock *)pIVar6[1].m_dst;
    if (pIVar2->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) goto LAB_00469b3b;
      *puVar5 = 0;
    }
    pIVar6 = pIVar2[1].m_next;
    if (*(char *)&(pIVar6[1].m_src2)->_vptr_Opnd != '\x03') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fec,"(catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch)",
                         "catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch");
      if (!bVar4) goto LAB_00469b3b;
      *puVar5 = 0;
    }
  }
  else {
    if (instr->m_opcode != BrOnException) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fdc,"(instr->m_opcode == Js::OpCode::BrOnNoException)",
                         "instr->m_opcode == Js::OpCode::BrOnNoException");
      if (!bVar4) goto LAB_00469b3b;
      *puVar5 = 0;
      goto LAB_004697ed;
    }
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) goto LAB_00469b3b;
      *puVar5 = 0;
    }
    pIVar6 = instr[1].m_next;
LAB_004698ca:
    predBlock = this->currentBlock;
  }
  succBlock = (BasicBlock *)pIVar6[1].m_dst;
  if (succBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ff2,"(catchBlock)","catchBlock");
    if (!bVar4) goto LAB_00469b3b;
    *puVar5 = 0;
  }
  if (predBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ff3,"(predBlock)","predBlock");
    if (!bVar4) {
LAB_00469b3b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pFVar7 = FlowGraph::FindEdge(this->func->m_fg,predBlock,succBlock);
  if ((pFVar7 != (FlowEdge *)0x0) &&
     (BasicBlock::RemoveDeadSucc(predBlock,succBlock,this->func->m_fg),
     predBlock == this->currentBlock)) {
    BasicBlock::DecrementDataUseCount(predBlock);
    return;
  }
  return;
}

Assistant:

void
GlobOpt::RemoveFlowEdgeToCatchBlock(IR::Instr * instr)
{
    Assert(instr->IsBranchInstr());

    BasicBlock * catchBlock = nullptr;
    BasicBlock * predBlock = nullptr;
    if (instr->m_opcode == Js::OpCode::BrOnException)
    {
        catchBlock = instr->AsBranchInstr()->GetTarget()->GetBasicBlock();
        predBlock = this->currentBlock;
    }
    else
    {
        Assert(instr->m_opcode == Js::OpCode::BrOnNoException);
        IR::Instr * nextInstr = instr->GetNextRealInstrOrLabel();
        Assert(nextInstr->IsLabelInstr());
        IR::LabelInstr * nextLabel = nextInstr->AsLabelInstr();

        if (nextLabel->GetRegion() && nextLabel->GetRegion()->GetType() == RegionTypeCatch)
        {
            catchBlock = nextLabel->GetBasicBlock();
            predBlock = this->currentBlock;
        }
        else
        {
            Assert(nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional());
            BasicBlock * nextBlock = nextLabel->GetBasicBlock();
            IR::BranchInstr * branchToCatchBlock = nextLabel->m_next->AsBranchInstr();
            IR::LabelInstr * catchBlockLabel = branchToCatchBlock->GetTarget();
            Assert(catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch);
            catchBlock = catchBlockLabel->GetBasicBlock();
            predBlock = nextBlock;
        }
    }

    Assert(catchBlock);
    Assert(predBlock);
    if (this->func->m_fg->FindEdge(predBlock, catchBlock))
    {
        predBlock->RemoveDeadSucc(catchBlock, this->func->m_fg);
        if (predBlock == this->currentBlock)
        {
            predBlock->DecrementDataUseCount();
        }
    }
}